

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5GetPoslistSize(u8 *p,int *pnSz,int *pbDel)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint *in_RDX;
  uint *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  int n;
  int nSz;
  uint in_stack_ffffffffffffffd0;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 1;
  bVar1 = *in_RDI;
  if ((bVar1 & 0x80) != 0) {
    iVar3 = 0;
    iVar4 = sqlite3Fts5GetVarint32((uchar *)in_RDX,(u32 *)(ulong)in_stack_ffffffffffffffd0);
    iVar4 = iVar4 + iVar3;
  }
  *in_RSI = bVar1 / 2;
  *in_RDX = bVar1 & 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5GetPoslistSize(const u8 *p, int *pnSz, int *pbDel){
  int nSz;
  int n = 0;
  fts5FastGetVarint32(p, n, nSz);
  assert_nc( nSz>=0 );
  *pnSz = nSz/2;
  *pbDel = nSz & 0x0001;
  return n;
}